

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O2

void __thiscall ncnn::Yolov3DetectionOutput::Yolov3DetectionOutput(Yolov3DetectionOutput *this)

{
  ParamDict pd;
  ParamDict local_920;
  
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Yolov3DetectionOutput_001795a8;
  (this->biases).data = (void *)0x0;
  (this->biases).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->biases).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->biases).elemsize + 4) = 0;
  (this->anchors_scale).allocator = (Allocator *)0x0;
  (this->anchors_scale).dims = 0;
  (this->anchors_scale).w = 0;
  (this->anchors_scale).h = 0;
  (this->anchors_scale).c = 0;
  (this->anchors_scale).cstep = 0;
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  (this->biases).allocator = (Allocator *)0x0;
  (this->biases).dims = 0;
  (this->biases).w = 0;
  (this->biases).h = 0;
  (this->biases).c = 0;
  (this->biases).cstep = 0;
  (this->mask).data = (void *)0x0;
  (this->mask).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->mask).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->mask).elemsize + 4) = 0;
  (this->mask).allocator = (Allocator *)0x0;
  (this->mask).dims = 0;
  (this->mask).w = 0;
  (this->mask).h = 0;
  (this->mask).c = 0;
  (this->mask).cstep = 0;
  (this->anchors_scale).data = (void *)0x0;
  (this->anchors_scale).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->anchors_scale).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->anchors_scale).elemsize + 4) = 0;
  ParamDict::ParamDict(&local_920);
  ParamDict::set(&local_920,0,0);
  ParamDict::~ParamDict(&local_920);
  return;
}

Assistant:

Yolov3DetectionOutput::Yolov3DetectionOutput()
{
    one_blob_only = false;
    support_inplace = false;
    
    //softmax = ncnn::create_layer(ncnn::LayerType::Softmax);

    // set param
    ncnn::ParamDict pd;
    pd.set(0, 0);// axis

    //softmax->load_param(pd);
}